

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# role.c
# Opt level: O2

boolean ok_race(int rolenum,int racenum,int gendnum,int alignnum)

{
  ushort uVar1;
  long lVar2;
  
  if ((uint)racenum < 6) {
    uVar1 = races[(uint)racenum].allow;
    if ((uint)rolenum < 0xe) {
      uVar1 = uVar1 & roles[(uint)rolenum].allow;
    }
    if (((1 < (uint)gendnum) || (0xfff < (genders[(uint)gendnum].allow & uVar1))) &&
       ((2 < (uint)alignnum || ((aligns[(uint)alignnum].allow & uVar1 & 7) != 0)))) {
      return (0xfff < uVar1 && (uVar1 & 0xff8) != 0) && (uVar1 & 7) != 0;
    }
  }
  else {
    for (lVar2 = 0x38; lVar2 != 0x248; lVar2 = lVar2 + 0x58) {
      uVar1 = *(ushort *)(races[0].attrmin + lVar2 + -0x40);
      if ((uint)rolenum < 0xe) {
        uVar1 = uVar1 & roles[(uint)rolenum].allow;
      }
      if ((((1 < (uint)gendnum) || (0xfff < (genders[(uint)gendnum].allow & uVar1))) &&
          ((2 < (uint)alignnum || ((aligns[(uint)alignnum].allow & uVar1 & 7) != 0)))) &&
         ((((uVar1 & 7) != 0 && ((uVar1 & 0xff8) != 0)) && (0xfff < uVar1)))) {
        return '\x01';
      }
    }
  }
  return '\0';
}

Assistant:

boolean ok_race(int rolenum, int racenum, int gendnum, int alignnum)
{
    int i;
    short allow;

    if (racenum >= 0 && racenum < SIZE(races)-1) {
	allow = races[racenum].allow;

	if (rolenum >= 0 && rolenum < SIZE(roles)-1)
	    allow &= roles[rolenum].allow;
	if (gendnum >= 0 && gendnum < ROLE_GENDERS &&
		!(allow & genders[gendnum].allow & ROLE_GENDMASK))
	    return FALSE;
	if (alignnum >= 0 && alignnum < ROLE_ALIGNS &&
		!(allow & aligns[alignnum].allow & ROLE_ALIGNMASK))
	    return FALSE;

	if (!(allow & ROLE_RACEMASK) || !(allow & ROLE_GENDMASK) ||
		!(allow & ROLE_ALIGNMASK))
	    return FALSE;
	return TRUE;
    } else {
	for (i = 0; i < SIZE(races)-1; i++) {
	    allow = races[i].allow;

	    if (rolenum >= 0 && rolenum < SIZE(roles)-1)
		allow &= roles[rolenum].allow;
	    if (gendnum >= 0 && gendnum < ROLE_GENDERS &&
		    !(allow & genders[gendnum].allow & ROLE_GENDMASK))
		continue;
	    if (alignnum >= 0 && alignnum < ROLE_ALIGNS &&
		    !(allow & aligns[alignnum].allow & ROLE_ALIGNMASK))
		continue;

	    if (!(allow & ROLE_RACEMASK) || !(allow & ROLE_GENDMASK) ||
		    !(allow & ROLE_ALIGNMASK))
		continue;
	    return TRUE;
	}
	return FALSE;
    }
}